

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

Expression * wasm::I64Utilities::recreateI64(Builder *builder,Expression *low,Expression *high)

{
  Unary *this;
  Unary *this_00;
  Const *pCVar1;
  Binary *this_01;
  Binary *this_02;
  
  this = (Unary *)MixedArena::allocSpace(&builder->wasm->allocator,0x20,8);
  (this->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
  (this->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
  this->op = ExtendUInt32;
  this->value = low;
  Unary::finalize(this);
  this_00 = (Unary *)MixedArena::allocSpace(&builder->wasm->allocator,0x20,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
  this_00->op = ExtendUInt32;
  this_00->value = high;
  Unary::finalize(this_00);
  pCVar1 = Builder::makeConst<long>(builder,0x20);
  this_01 = (Binary *)MixedArena::allocSpace(&builder->wasm->allocator,0x28,8);
  (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  this_01->op = ShlInt64;
  this_01->left = (Expression *)this_00;
  this_01->right = (Expression *)pCVar1;
  Binary::finalize(this_01);
  this_02 = (Binary *)MixedArena::allocSpace(&builder->wasm->allocator,0x28,8);
  (this_02->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (this_02->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  this_02->op = OrInt64;
  this_02->left = (Expression *)this;
  this_02->right = (Expression *)this_01;
  Binary::finalize(this_02);
  return (Expression *)this_02;
}

Assistant:

static Expression*
  recreateI64(Builder& builder, Expression* low, Expression* high) {
    return builder.makeBinary(
      OrInt64,
      builder.makeUnary(ExtendUInt32, low),
      builder.makeBinary(ShlInt64,
                         builder.makeUnary(ExtendUInt32, high),
                         builder.makeConst(int64_t(32))));
  }